

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsExtensions
               (Descriptor *message)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  Descriptor *message_00;
  ulong uVar5;
  
  bVar3 = true;
  if (*(int *)(message + 0x78) < 1) {
    uVar5 = (ulong)*(int *)(message + 0x48);
    bVar3 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      message_00 = *(Descriptor **)(message + 0x50);
      bVar2 = MessageContainsExtensions(message_00);
      if (!bVar2) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          message_00 = message_00 + 0xa8;
          if (uVar5 == uVar4) break;
          bVar3 = MessageContainsExtensions(message_00);
          uVar1 = uVar4 + 1;
        } while (!bVar3);
        bVar3 = uVar4 < uVar5;
      }
    }
  }
  return bVar3;
}

Assistant:

bool MessageContainsExtensions(const Descriptor* message) {
  if (message->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsExtensions(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}